

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++:211:40)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_test_c__:211:40)>
             *this)

{
  anon_class_16_2_8fc7c391_for_f *paVar1;
  uint uVar2;
  MutexGuarded<unsigned_int> *pMVar3;
  uint m;
  PredicateImpl impl;
  uint local_74;
  undefined1 local_70 [40];
  DebugComparison<unsigned_int_&,_const_int_&> local_48;
  
  paVar1 = &this->f;
  local_74 = (this->f).i;
  if ((local_74 & 1) == 0) {
    anon_unknown_0::delay();
    local_74 = paVar1->i;
  }
  pMVar3 = (this->f).value;
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)local_70,pMVar3);
  local_48.left = (uint *)&PTR_check_0021ced0;
  local_48.right = (int *)&local_74;
  local_48.op.content.ptr = (char *)local_70._8_8_;
  local_70[0x18] = 0;
  _::Mutex::wait((Mutex *)local_70._0_8_,&local_48);
  uVar2 = pMVar3->value;
  pMVar3->value = uVar2 + 1;
  Locked<unsigned_int>::~Locked((Locked<unsigned_int> *)local_70);
  local_48.left = (uint *)(local_70 + 0x14);
  local_48.result = uVar2 == paVar1->i;
  local_48.op.content.ptr = " == ";
  local_48.op.content.size_ = 5;
  if (local_48.result) {
    return;
  }
  local_70._20_4_ = uVar2;
  local_48.right = &paVar1->i;
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int_const&>&>
            ((Fault *)(local_70 + 0x18),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
             ,0xd7,FAILED,"m == i","_kjCondition,",&local_48);
  _::Debug::Fault::fatal((Fault *)(local_70 + 0x18));
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }